

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O2

QString * __thiscall
QTextDocumentPrivate::plainText(QString *__return_storage_ptr__,QTextDocumentPrivate *this)

{
  QTextFragmentData *pQVar1;
  QChar *__dest;
  ulong uVar2;
  char16_t *pcVar3;
  long in_FS_OFFSET;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  length(this);
  QString::resize((longlong)__return_storage_ptr__);
  pcVar3 = (this->text).d.ptr;
  if (pcVar3 == (char16_t *)0x0) {
    pcVar3 = (char16_t *)&QString::_empty;
  }
  __dest = QString::data(__return_storage_ptr__);
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QFragmentMap<QTextFragmentData>::begin((QFragmentMap<QTextFragmentData> *)local_48);
  while( true ) {
    if (local_48._8_4_ == 0 && (FragmentMap *)local_48._0_8_ == &this->fragments) break;
    uVar2 = local_48._8_8_ & 0xffffffff;
    pQVar1 = (((QFragmentMapData<QTextFragmentData> *)local_48._0_8_)->field_0).fragments;
    memcpy(__dest,pcVar3 + pQVar1[uVar2].stringPosition,
           (ulong)pQVar1[uVar2].super_QFragment<1>.size_array[0] * 2);
    __dest = __dest + pQVar1[uVar2].super_QFragment<1>.size_array[0];
    QFragmentMap<QTextFragmentData>::ConstIterator::operator++((ConstIterator *)local_48);
  }
  QString::chop((longlong)__return_storage_ptr__);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QTextDocumentPrivate::plainText() const
{
    QString result;
    result.resize(length());
    const QChar *text_unicode = text.unicode();
    QChar *data = result.data();
    for (QTextDocumentPrivate::FragmentIterator it = begin(); it != end(); ++it) {
        const QTextFragmentData *f = *it;
        ::memcpy(data, text_unicode + f->stringPosition, f->size_array[0] * sizeof(QChar));
        data += f->size_array[0];
    }
    // remove trailing block separator
    result.chop(1);
    return result;
}